

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O0

void __thiscall Descriptor_CheckChecksum_Test::TestBody(Descriptor_CheckChecksum_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  reference this_00;
  char *in_R9;
  AssertionResult gtest_ar_3;
  CfdException *except;
  Message local_7d8;
  string local_7d0;
  undefined1 local_7b0 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_780;
  Message local_778;
  bool local_769;
  undefined1 local_768 [8];
  AssertionResult gtest_ar_;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> key_list;
  Message local_738;
  undefined1 local_730 [8];
  AssertionResult gtest_ar_1;
  Message local_718;
  string local_710;
  AssertHelper local_6f0;
  Message local_6e8;
  Descriptor local_6e0;
  AssertHelper local_578;
  Message local_570 [2];
  CfdException *anon_var_0;
  byte local_3f1;
  char *pcStack_3f0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  Message local_3e0;
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar;
  Message local_3c0;
  string local_3b8;
  AssertHelper local_398;
  Message local_390 [2];
  Descriptor local_380;
  allocator local_211;
  string local_210 [8];
  string desc_str;
  Descriptor desc;
  string fail_descriptor;
  string success_descriptor;
  allocator local_31;
  undefined1 local_30 [8];
  string base_descriptor;
  Descriptor_CheckChecksum_Test *this_local;
  
  base_descriptor.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_30,
             "sh(wpkh([ef57314e/0\'/0\'/4\']03d3f817091de0bbe51e19b53303b12e463f664894d49cb5bf5bb19c88fbc54d8d))"
             ,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&fail_descriptor.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                 "#euerft8t");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&desc.root_node_.parent_kind_.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                 "#euerfa8t");
  cfd::core::Descriptor::Descriptor((Descriptor *)((long)&desc_str.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_210,"",&local_211);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::Parse
                (&local_380,(string *)((long)&fail_descriptor.field_2 + 8),
                 (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)0x0);
      cfd::core::Descriptor::operator=((Descriptor *)((long)&desc_str.field_2 + 8),&local_380);
      cfd::core::Descriptor::~Descriptor(&local_380);
    }
  }
  else {
    testing::Message::Message(local_390);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x3b7,
               "Expected: desc = Descriptor::Parse(success_descriptor) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_398,local_390);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    testing::Message::~Message(local_390);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::ToString_abi_cxx11_
                (&local_3b8,(Descriptor *)((long)&desc_str.field_2 + 8),true);
      std::__cxx11::string::operator=(local_210,(string *)&local_3b8);
      std::__cxx11::string::~string((string *)&local_3b8);
    }
  }
  else {
    testing::Message::Message(&local_3c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x3b8,
               "Expected: desc_str = desc.ToString() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,&local_3c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(&local_3c0);
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_3d8,"desc_str.c_str()","success_descriptor.c_str()",pcVar2,pcVar3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d8);
  if (!bVar1) {
    testing::Message::Message(&local_3e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x3b9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg,&local_3e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg);
    testing::Message::~Message(&local_3e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffc10,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffc10);
  if (bVar1) {
    local_3f1 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::Parse
                ((Descriptor *)&anon_var_0,
                 (string *)((long)&desc.root_node_.parent_kind_.field_2 + 8),
                 (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)0x0);
      cfd::core::Descriptor::operator=
                ((Descriptor *)((long)&desc_str.field_2 + 8),(Descriptor *)&anon_var_0);
      cfd::core::Descriptor::~Descriptor((Descriptor *)&anon_var_0);
    }
    if ((local_3f1 & 1) != 0) goto LAB_0035d3d8;
    pcStack_3f0 = 
    "Expected: (desc = Descriptor::Parse(fail_descriptor)) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_570);
  testing::internal::AssertHelper::AssertHelper
            (&local_578,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
             ,0x3bb,pcStack_3f0);
  testing::internal::AssertHelper::operator=(&local_578,local_570);
  testing::internal::AssertHelper::~AssertHelper(&local_578);
  testing::Message::~Message(local_570);
LAB_0035d3d8:
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::Parse
                (&local_6e0,(string *)local_30,
                 (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)0x0);
      cfd::core::Descriptor::operator=((Descriptor *)((long)&desc_str.field_2 + 8),&local_6e0);
      cfd::core::Descriptor::~Descriptor(&local_6e0);
    }
  }
  else {
    testing::Message::Message(&local_6e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_6f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x3bd,
               "Expected: desc = Descriptor::Parse(base_descriptor) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_6f0,&local_6e8);
    testing::internal::AssertHelper::~AssertHelper(&local_6f0);
    testing::Message::~Message(&local_6e8);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::ToString_abi_cxx11_
                (&local_710,(Descriptor *)((long)&desc_str.field_2 + 8),true);
      std::__cxx11::string::operator=(local_210,(string *)&local_710);
      std::__cxx11::string::~string((string *)&local_710);
    }
  }
  else {
    testing::Message::Message(&local_718);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x3be,
               "Expected: desc_str = desc.ToString() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_718);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_718);
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_730,"desc_str.c_str()","success_descriptor.c_str()",pcVar2,pcVar3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_730);
  if (!bVar1) {
    testing::Message::Message(&local_738);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_730);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x3bf,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_738);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_738);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_730);
  cfd::core::Descriptor::GetKeyDataAll
            ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)&gtest_ar_.message_,
             (Descriptor *)((long)&desc_str.field_2 + 8),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x0);
  local_769 = std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::empty
                        ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
                         &gtest_ar_.message_);
  local_769 = !local_769;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_768,&local_769,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_768);
  if (!bVar1) {
    testing::Message::Message(&local_778);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_2.message_,(internal *)local_768,
               (AssertionResult *)"key_list.empty()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_780,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x3c2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_780,&local_778);
    testing::internal::AssertHelper::~AssertHelper(&local_780);
    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_778);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_768);
  bVar1 = std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::empty
                    ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
                     &gtest_ar_.message_);
  if (!bVar1) {
    this_00 = std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::operator[]
                        ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
                         &gtest_ar_.message_,0);
    cfd::core::KeyData::ToString_abi_cxx11_(&local_7d0,this_00,true,kApostrophe,false);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_7b0,"key_list[0].ToString().c_str()",
               "\"[ef57314e/0\'/0\'/4\']03d3f817091de0bbe51e19b53303b12e463f664894d49cb5bf5bb19c88fbc54d8d\""
               ,pcVar2,
               "[ef57314e/0\'/0\'/4\']03d3f817091de0bbe51e19b53303b12e463f664894d49cb5bf5bb19c88fbc54d8d"
              );
    std::__cxx11::string::~string((string *)&local_7d0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7b0);
    if (!bVar1) {
      testing::Message::Message(&local_7d8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7b0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&except,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
                 ,0x3c5,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&except,&local_7d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&except);
      testing::Message::~Message(&local_7d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_7b0);
  }
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
            ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)&gtest_ar_.message_)
  ;
  std::__cxx11::string::~string(local_210);
  cfd::core::Descriptor::~Descriptor((Descriptor *)((long)&desc_str.field_2 + 8));
  std::__cxx11::string::~string((string *)(desc.root_node_.parent_kind_.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(fail_descriptor.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(Descriptor, CheckChecksum) {
  std::string base_descriptor = "sh(wpkh([ef57314e/0'/0'/4']03d3f817091de0bbe51e19b53303b12e463f664894d49cb5bf5bb19c88fbc54d8d))";
  std::string success_descriptor = base_descriptor + "#euerft8t";
  std::string fail_descriptor = base_descriptor + "#euerfa8t";
  Descriptor desc;
  std::string desc_str = "";

  EXPECT_NO_THROW(desc = Descriptor::Parse(success_descriptor));
  EXPECT_NO_THROW(desc_str = desc.ToString());
  EXPECT_STREQ(desc_str.c_str(), success_descriptor.c_str());

  EXPECT_THROW((desc = Descriptor::Parse(fail_descriptor)), CfdException);

  EXPECT_NO_THROW(desc = Descriptor::Parse(base_descriptor));
  EXPECT_NO_THROW(desc_str = desc.ToString());
  EXPECT_STREQ(desc_str.c_str(), success_descriptor.c_str());
  try {
    auto key_list = desc.GetKeyDataAll();
    EXPECT_FALSE(key_list.empty());
    if (!key_list.empty()) {
      EXPECT_STREQ(key_list[0].ToString().c_str(),
        "[ef57314e/0'/0'/4']03d3f817091de0bbe51e19b53303b12e463f664894d49cb5bf5bb19c88fbc54d8d");
    }
  } catch (const CfdException& except) {
    EXPECT_STREQ(except.what(), "");
  }
}